

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void QFileDialog::saveFileContent(QByteArray *fileContent,QString *fileNameHint,QWidget *parent)

{
  QArrayData *pQVar1;
  char *pcVar2;
  qsizetype qVar3;
  QWidget *this;
  undefined4 *puVar4;
  long in_FS_OFFSET;
  QObject local_90 [8];
  QString local_88;
  QString local_68;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QWidget *)operator_new(0x28);
  local_48.d.size = 0;
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_68.d.size = 0;
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char16_t *)0x0;
  local_88.d.size = 0;
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (char16_t *)0x0;
  QFileDialog((QFileDialog *)this,parent,&local_48,&local_68,&local_88);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  setAcceptMode((QFileDialog *)this,AcceptSave);
  setFileMode((QFileDialog *)this,AnyFile);
  selectFile((QFileDialog *)this,fileNameHint);
  pQVar1 = &((fileContent->d).d)->super_QArrayData;
  pcVar2 = (fileContent->d).ptr;
  qVar3 = (fileContent->d).size;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48.d.d = (Data *)fileSelected;
  local_48.d.ptr = (char16_t *)0x0;
  puVar4 = (undefined4 *)operator_new(0x28);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/dialogs/qfiledialog.cpp:2369:25),_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(QArrayData **)(puVar4 + 4) = pQVar1;
  *(char **)(puVar4 + 6) = pcVar2;
  *(qsizetype *)(puVar4 + 8) = qVar3;
  if (pQVar1 == (QArrayData *)0x0) {
    QObject::connectImpl
              (local_90,(void **)this,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_90);
    QWidget::setAttribute(this,WA_DeleteOnClose,true);
    QWidget::show(this);
  }
  else {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    QObject::connectImpl
              (local_90,(void **)this,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_90);
    QWidget::setAttribute(this,WA_DeleteOnClose,true);
    QWidget::show(this);
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialog::saveFileContent(const QByteArray &fileContent, const QString &fileNameHint, QWidget *parent)
{
#ifdef Q_OS_WASM
    Q_UNUSED(parent);
    QWasmLocalFileAccess::saveFile(fileContent, fileNameHint.toStdString());
#else
    QFileDialog *dialog = new QFileDialog(parent);
    dialog->setAcceptMode(QFileDialog::AcceptSave);
    dialog->setFileMode(QFileDialog::AnyFile);
    dialog->selectFile(fileNameHint);

    auto fileSelected = [=](const QString &fileName) {
        if (!fileName.isNull()) {
            QFile selectedFile(fileName);
            if (selectedFile.open(QIODevice::WriteOnly))
                selectedFile.write(fileContent);
        }
    };

    connect(dialog, &QFileDialog::fileSelected, dialog, fileSelected);
    dialog->setAttribute(Qt::WA_DeleteOnClose);
    dialog->show();
#endif
}